

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

FuncInfo * __thiscall ByteCodeGenerator::GetEnclosingFuncInfo(ByteCodeGenerator *this)

{
  Type pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  FuncInfo *local_20;
  FuncInfo *top;
  
  local_20 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Pop(this->funcInfoStack);
  this_00 = this->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x746,"(!this->funcInfoStack->Empty())","!this->funcInfoStack->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    this_00 = this->funcInfoStack;
  }
  ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar1 = *ppFVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Prepend(this->funcInfoStack,&local_20);
  return pFVar1;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetEnclosingFuncInfo()
{
    FuncInfo* top = this->funcInfoStack->Pop();

    Assert(!this->funcInfoStack->Empty());

    FuncInfo* second = this->funcInfoStack->Top();

    this->funcInfoStack->Push(top);

    return second;
}